

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Int64Vector::ByteSizeLong(Int64Vector *this)

{
  int iVar1;
  size_t size;
  size_t sVar2;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  Int64Vector *this_local;
  
  data_size = 0;
  size = google::protobuf::internal::WireFormatLite::Int64Size(&this->vector_);
  if (size != 0) {
    sVar2 = google::protobuf::internal::WireFormatLite::Int32Size((int32)size);
    data_size = sVar2 + 1;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(size);
  this->_vector_cached_byte_size_ = iVar1;
  iVar1 = google::protobuf::internal::ToCachedSize(size + data_size);
  this->_cached_size_ = iVar1;
  return size + data_size;
}

Assistant:

size_t Int64Vector::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Int64Vector)
  size_t total_size = 0;

  // repeated int64 vector = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->vector_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _vector_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}